

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O3

VarType * __thiscall
deqp::gles31::Functional::anon_unknown_1::RandomSSBOLayoutCase::generateType
          (VarType *__return_storage_ptr__,RandomSSBOLayoutCase *this,Random *rnd,int typeDepth,
          bool arrayOk,bool unsizedArrayOk)

{
  int *piVar1;
  Precision basicType;
  deUint32 dVar2;
  undefined8 *puVar3;
  VarType *extraout_RAX;
  VarType *extraout_RAX_00;
  VarType *extraout_RAX_01;
  StructType *this_00;
  long *plVar4;
  VarType *extraout_RAX_02;
  uint uVar5;
  long *plVar6;
  Precision precision;
  ulong uVar7;
  undefined8 uVar8;
  int ndx;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  ulong uVar9;
  int iVar10;
  long lVar11;
  float fVar12;
  VarType elementType;
  DataType val;
  vector<glu::VarType,_std::allocator<glu::VarType>_> memberTypes;
  __normal_iterator<glu::DataType_*,_std::vector<glu::DataType,_std::allocator<glu::DataType>_>_>
  local_c8;
  Data DStack_c0;
  long lStack_b0;
  ulong *local_a0;
  ulong local_98;
  ulong local_90 [2];
  uint local_7c;
  string local_78;
  vector<glu::VarType,_std::allocator<glu::VarType>_> local_58;
  VarType *local_40;
  ulong local_38;
  
  ndx = (int)CONCAT71(in_register_00000081,arrayOk);
  if (((int)CONCAT71(in_register_00000089,unsizedArrayOk) != 0) &&
     (fVar12 = deRandom_getFloat(&rnd->m_rnd), fVar12 < 0.8)) {
    generateType((VarType *)&local_c8,this,rnd,typeDepth,(bool)((byte)(this->m_features >> 0xe) & 1)
                 ,false);
    glu::VarType::VarType(__return_storage_ptr__,(VarType *)&local_c8,-1);
LAB_0149c7d8:
    glu::VarType::~VarType((VarType *)&local_c8);
    return extraout_RAX;
  }
  if ((this->m_maxStructDepth <= typeDepth) ||
     (fVar12 = deRandom_getFloat(&rnd->m_rnd), 0.1 <= fVar12)) {
    if ((!arrayOk || this->m_maxArrayLength < 1) ||
       (fVar12 = deRandom_getFloat(&rnd->m_rnd), 0.1 <= fVar12)) {
      local_c8._M_current = (DataType *)0x0;
      DStack_c0.array.elementType = (VarType *)0x0;
      DStack_c0.array.size = TYPE_INVALID;
      DStack_c0._12_4_ = PRECISION_LOWP;
      local_a0._0_4_ = 1;
      std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,(iterator)0x0,
                 (DataType *)&local_a0);
      local_a0._0_4_ = 0x1b;
      if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                   (iterator)DStack_c0.basic,(DataType *)&local_a0);
      }
      else {
        (DStack_c0.array.elementType)->m_type = 0x1b;
        DStack_c0.array.elementType =
             (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
      }
      local_a0._0_4_ = 0x1f;
      if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                   (iterator)DStack_c0.basic,(DataType *)&local_a0);
      }
      else {
        (DStack_c0.array.elementType)->m_type = 0x1f;
        DStack_c0.array.elementType =
             (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
      }
      local_a0._0_4_ = 0x23;
      if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                   (iterator)DStack_c0.basic,(DataType *)&local_a0);
      }
      else {
        (DStack_c0.array.elementType)->m_type = 0x23;
        DStack_c0.array.elementType =
             (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
      }
      uVar5 = this->m_features;
      if ((uVar5 & 1) != 0) {
        local_a0._0_4_ = 2;
        if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                     (iterator)DStack_c0.basic,(DataType *)&local_a0);
        }
        else {
          (DStack_c0.array.elementType)->m_type = TYPE_STRUCT;
          DStack_c0.array.elementType =
               (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
        }
        local_a0._0_4_ = 3;
        if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                     (iterator)DStack_c0.basic,(DataType *)&local_a0);
        }
        else {
          (DStack_c0.array.elementType)->m_type = TYPE_LAST;
          DStack_c0.array.elementType =
               (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
        }
        local_a0._0_4_ = 4;
        if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                     (iterator)DStack_c0.basic,(DataType *)&local_a0);
        }
        else {
          (DStack_c0.array.elementType)->m_type = 4;
          DStack_c0.array.elementType =
               (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
        }
        local_a0._0_4_ = 0x1c;
        if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                     (iterator)DStack_c0.basic,(DataType *)&local_a0);
        }
        else {
          (DStack_c0.array.elementType)->m_type = 0x1c;
          DStack_c0.array.elementType =
               (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
        }
        local_a0._0_4_ = 0x1d;
        if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                     (iterator)DStack_c0.basic,(DataType *)&local_a0);
        }
        else {
          (DStack_c0.array.elementType)->m_type = 0x1d;
          DStack_c0.array.elementType =
               (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
        }
        local_a0._0_4_ = 0x1e;
        if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                     (iterator)DStack_c0.basic,(DataType *)&local_a0);
        }
        else {
          (DStack_c0.array.elementType)->m_type = 0x1e;
          DStack_c0.array.elementType =
               (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
        }
        local_a0._0_4_ = 0x20;
        if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                     (iterator)DStack_c0.basic,(DataType *)&local_a0);
        }
        else {
          (DStack_c0.array.elementType)->m_type = 0x20;
          DStack_c0.array.elementType =
               (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
        }
        local_a0._0_4_ = 0x21;
        if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                     (iterator)DStack_c0.basic,(DataType *)&local_a0);
        }
        else {
          (DStack_c0.array.elementType)->m_type = 0x21;
          DStack_c0.array.elementType =
               (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
        }
        local_a0._0_4_ = 0x22;
        if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                     (iterator)DStack_c0.basic,(DataType *)&local_a0);
        }
        else {
          (DStack_c0.array.elementType)->m_type = 0x22;
          DStack_c0.array.elementType =
               (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
        }
        local_a0._0_4_ = 0x24;
        if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                     (iterator)DStack_c0.basic,(DataType *)&local_a0);
        }
        else {
          (DStack_c0.array.elementType)->m_type = 0x24;
          DStack_c0.array.elementType =
               (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
        }
        local_a0._0_4_ = 0x25;
        if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                     (iterator)DStack_c0.basic,(DataType *)&local_a0);
        }
        else {
          (DStack_c0.array.elementType)->m_type = 0x25;
          DStack_c0.array.elementType =
               (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
        }
        local_a0._0_4_ = 0x26;
        if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                     (iterator)DStack_c0.basic,(DataType *)&local_a0);
        }
        else {
          (DStack_c0.array.elementType)->m_type = 0x26;
          DStack_c0.array.elementType =
               (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
        }
        uVar5 = this->m_features;
      }
      if ((uVar5 & 2) != 0) {
        local_a0._0_4_ = 5;
        if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                     (iterator)DStack_c0.basic,(DataType *)&local_a0);
        }
        else {
          (DStack_c0.array.elementType)->m_type = 5;
          DStack_c0.array.elementType =
               (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
        }
        local_a0._0_4_ = 6;
        if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                     (iterator)DStack_c0.basic,(DataType *)&local_a0);
        }
        else {
          (DStack_c0.array.elementType)->m_type = 6;
          DStack_c0.array.elementType =
               (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
        }
        local_a0._0_4_ = 8;
        if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                     (iterator)DStack_c0.basic,(DataType *)&local_a0);
        }
        else {
          (DStack_c0.array.elementType)->m_type = 8;
          DStack_c0.array.elementType =
               (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
        }
        local_a0._0_4_ = 9;
        if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                     (iterator)DStack_c0.basic,(DataType *)&local_a0);
        }
        else {
          (DStack_c0.array.elementType)->m_type = 9;
          DStack_c0.array.elementType =
               (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
        }
        local_a0._0_4_ = 10;
        if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                     (iterator)DStack_c0.basic,(DataType *)&local_a0);
        }
        else {
          (DStack_c0.array.elementType)->m_type = 10;
          DStack_c0.array.elementType =
               (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
        }
        local_a0._0_4_ = 0xb;
        if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                     (iterator)DStack_c0.basic,(DataType *)&local_a0);
        }
        else {
          (DStack_c0.array.elementType)->m_type = 0xb;
          DStack_c0.array.elementType =
               (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
        }
        local_a0._0_4_ = 0xc;
        if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                     (iterator)DStack_c0.basic,(DataType *)&local_a0);
        }
        else {
          (DStack_c0.array.elementType)->m_type = 0xc;
          DStack_c0.array.elementType =
               (VarType *)((long)&((DStack_c0.structPtr)->m_typeName)._M_dataplus._M_p + 4);
        }
        local_a0._0_4_ = 0xd;
        if (DStack_c0.array.elementType == (VarType *)DStack_c0._8_8_) {
          std::vector<glu::DataType,_std::allocator<glu::DataType>_>::
          _M_realloc_insert<glu::DataType>
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_c8,
                     (iterator)DStack_c0.basic,(DataType *)&local_a0);
        }
        else {
          (DStack_c0.array.elementType)->m_type = 0xd;
          DStack_c0.array.elementType = (VarType *)&(DStack_c0.array.elementType)->field_0x4;
        }
      }
      local_a0._0_4_ = PRECISION_LOWP;
      de::Random::
      choose<__gnu_cxx::__normal_iterator<glu::DataType*,std::vector<glu::DataType,std::allocator<glu::DataType>>>,glu::DataType*>
                (rnd,local_c8,
                 (__normal_iterator<glu::DataType_*,_std::vector<glu::DataType,_std::allocator<glu::DataType>_>_>
                  )DStack_c0.basic,(DataType *)&local_a0,1);
      basicType = (Precision)local_a0;
      precision = PRECISION_LAST;
      if (3 < (Precision)local_a0 - 0x23) {
        local_a0._0_4_ = PRECISION_LOWP;
        de::Random::choose<glu::Precision_const*,glu::Precision*>
                  (rnd,generateType::precisionCandidates,(Precision *)"Test array.length()",
                   (Precision *)&local_a0,1);
        precision = (Precision)local_a0;
      }
      glu::VarType::VarType(__return_storage_ptr__,basicType,precision);
      if (local_c8._M_current == (DataType *)0x0) {
        return extraout_RAX_00;
      }
      operator_delete(local_c8._M_current,DStack_c0._8_8_ - (long)local_c8._M_current);
      return extraout_RAX_01;
    }
    uVar5 = this->m_maxArrayLength;
    dVar2 = deRandom_getUint32(&rnd->m_rnd);
    generateType((VarType *)&local_c8,this,rnd,typeDepth,(bool)((byte)(this->m_features >> 0xe) & 1)
                 ,false);
    glu::VarType::VarType(__return_storage_ptr__,(VarType *)&local_c8,dVar2 % uVar5 + 1);
    goto LAB_0149c7d8;
  }
  local_58.super__Vector_base<glu::VarType,_std::allocator<glu::VarType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<glu::VarType,_std::allocator<glu::VarType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<glu::VarType,_std::allocator<glu::VarType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = this->m_maxStructMembers;
  local_40 = __return_storage_ptr__;
  dVar2 = deRandom_getUint32(&rnd->m_rnd);
  iVar10 = 0;
  local_38 = (ulong)dVar2 % (ulong)uVar5;
  local_7c = (uint)local_38 + 1;
  if ((uint)local_38 < 0x7fffffff) {
    do {
      ndx = 1;
      generateType((VarType *)&local_c8,this,rnd,typeDepth + 1,true,false);
      std::vector<glu::VarType,_std::allocator<glu::VarType>_>::emplace_back<glu::VarType>
                (&local_58,(VarType *)&local_c8);
      glu::VarType::~VarType((VarType *)&local_c8);
      iVar10 = iVar10 + 1;
    } while (iVar10 < (int)local_7c);
  }
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"s","");
  Functional::(anonymous_namespace)::genName_abi_cxx11_
            (&local_78,(_anonymous_namespace_ *)0x41,'Z',(char)this->m_structNdx,ndx);
  uVar7 = 0xf;
  if (local_a0 != local_90) {
    uVar7 = local_90[0];
  }
  if (uVar7 < local_78._M_string_length + local_98) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar8 = local_78.field_2._M_allocated_capacity;
    }
    if (local_78._M_string_length + local_98 <= (ulong)uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_a0);
      goto LAB_0149cdc8;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_78._M_dataplus._M_p);
LAB_0149cdc8:
  local_c8._M_current = (DataType *)&DStack_c0.array.size;
  plVar4 = puVar3 + 2;
  if ((long *)*puVar3 == plVar4) {
    DStack_c0._8_8_ = *plVar4;
    lStack_b0 = puVar3[3];
  }
  else {
    DStack_c0._8_8_ = *plVar4;
    local_c8._M_current = (DataType *)*puVar3;
  }
  DStack_c0.basic = *(anon_struct_8_2_bfd9d0cb_for_basic *)(puVar3 + 1);
  *puVar3 = plVar4;
  puVar3[1] = 0;
  *(undefined1 *)plVar4 = 0;
  this_00 = bb::ShaderInterface::allocStruct
                      (&(this->super_SSBOLayoutCase).m_interface,(char *)local_c8._M_current);
  piVar1 = &DStack_c0.array.size;
  if (local_c8._M_current != (DataType *)piVar1) {
    operator_delete(local_c8._M_current,DStack_c0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  this->m_structNdx = this->m_structNdx + 1;
  if ((uint)local_38 < 0x7fffffff) {
    uVar7 = (ulong)local_7c;
    lVar11 = 0;
    uVar9 = 0;
    do {
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"m","");
      plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_a0,local_98,0,'\x01');
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        DStack_c0._8_8_ = *plVar6;
        lStack_b0 = plVar4[3];
        local_c8._M_current = (DataType *)piVar1;
      }
      else {
        DStack_c0._8_8_ = *plVar6;
        local_c8._M_current = (DataType *)*plVar4;
      }
      DStack_c0.basic = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar4 + 1);
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      glu::StructType::addMember
                (this_00,(char *)local_c8._M_current,
                 (VarType *)
                 ((long)&(local_58.super__Vector_base<glu::VarType,_std::allocator<glu::VarType>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_type + lVar11));
      if (local_c8._M_current != (DataType *)piVar1) {
        operator_delete(local_c8._M_current,DStack_c0._8_8_ + 1);
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0,local_90[0] + 1);
      }
      uVar9 = uVar9 + 1;
      lVar11 = lVar11 + 0x18;
    } while (uVar9 < uVar7);
  }
  glu::VarType::VarType(local_40,this_00);
  std::vector<glu::VarType,_std::allocator<glu::VarType>_>::~vector(&local_58);
  return extraout_RAX_02;
}

Assistant:

glu::VarType RandomSSBOLayoutCase::generateType (de::Random& rnd, int typeDepth, bool arrayOk, bool unsizedArrayOk)
{
	const float structWeight		= 0.1f;
	const float arrayWeight			= 0.1f;
	const float	unsizedArrayWeight	= 0.8f;

	DE_ASSERT(arrayOk || !unsizedArrayOk);

	if (unsizedArrayOk && (rnd.getFloat() < unsizedArrayWeight))
	{
		const bool			childArrayOk	= (m_features & FEATURE_ARRAYS_OF_ARRAYS) != 0;
		const glu::VarType	elementType		= generateType(rnd, typeDepth, childArrayOk, false);
		return glu::VarType(elementType, glu::VarType::UNSIZED_ARRAY);
	}
	else if (typeDepth < m_maxStructDepth && rnd.getFloat() < structWeight)
	{
		// \todo [2013-10-14 pyry] Implement unused flags for members!
//		bool					unusedOk			= (m_features & FEATURE_UNUSED_MEMBERS) != 0;
		vector<glu::VarType>	memberTypes;
		int						numMembers = rnd.getInt(1, m_maxStructMembers);

		// Generate members first so nested struct declarations are in correct order.
		for (int ndx = 0; ndx < numMembers; ndx++)
			memberTypes.push_back(generateType(rnd, typeDepth+1, true, false));

		glu::StructType& structType = m_interface.allocStruct((string("s") + genName('A', 'Z', m_structNdx)).c_str());
		m_structNdx += 1;

		DE_ASSERT(numMembers <= 'Z' - 'A');
		for (int ndx = 0; ndx < numMembers; ndx++)
		{
			structType.addMember((string("m") + (char)('A' + ndx)).c_str(), memberTypes[ndx]);
		}

		return glu::VarType(&structType);
	}
	else if (m_maxArrayLength > 0 && arrayOk && rnd.getFloat() < arrayWeight)
	{
		const int			arrayLength		= rnd.getInt(1, m_maxArrayLength);
		const bool			childArrayOk	= (m_features & FEATURE_ARRAYS_OF_ARRAYS) != 0;
		const glu::VarType	elementType		= generateType(rnd, typeDepth, childArrayOk, false);

		return glu::VarType(elementType, arrayLength);
	}
	else
	{
		vector<glu::DataType> typeCandidates;

		typeCandidates.push_back(glu::TYPE_FLOAT);
		typeCandidates.push_back(glu::TYPE_INT);
		typeCandidates.push_back(glu::TYPE_UINT);
		typeCandidates.push_back(glu::TYPE_BOOL);

		if (m_features & FEATURE_VECTORS)
		{
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC2);
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC3);
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC4);
			typeCandidates.push_back(glu::TYPE_INT_VEC2);
			typeCandidates.push_back(glu::TYPE_INT_VEC3);
			typeCandidates.push_back(glu::TYPE_INT_VEC4);
			typeCandidates.push_back(glu::TYPE_UINT_VEC2);
			typeCandidates.push_back(glu::TYPE_UINT_VEC3);
			typeCandidates.push_back(glu::TYPE_UINT_VEC4);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC2);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC3);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC4);
		}

		if (m_features & FEATURE_MATRICES)
		{
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT2X3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3X2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3X4);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4X2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4X3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4);
		}

		glu::DataType	type		= rnd.choose<glu::DataType>(typeCandidates.begin(), typeCandidates.end());
		glu::Precision	precision;

		if (!glu::isDataTypeBoolOrBVec(type))
		{
			// Precision.
			static const glu::Precision precisionCandidates[] = { glu::PRECISION_LOWP, glu::PRECISION_MEDIUMP, glu::PRECISION_HIGHP };
			precision = rnd.choose<glu::Precision>(&precisionCandidates[0], &precisionCandidates[DE_LENGTH_OF_ARRAY(precisionCandidates)]);
		}
		else
			precision = glu::PRECISION_LAST;

		return glu::VarType(type, precision);
	}
}